

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_arange.c
# Opt level: O1

int dwarf_get_aranges(Dwarf_Debug dbg,Dwarf_Arange **aranges,Dwarf_Signed *returned_count,
                     Dwarf_Error *error)

{
  byte *pbVar1;
  byte *endsection;
  byte *end_arange;
  byte bVar2;
  Dwarf_Unsigned DVar3;
  Dwarf_Chain pDVar4;
  bool bVar5;
  Dwarf_Small *pDVar6;
  int iVar7;
  int iVar8;
  Dwarf_Chain_conflict pDVar9;
  char *pcVar10;
  Dwarf_Arange *ppDVar11;
  Dwarf_Signed errval;
  ulong uVar12;
  dwarfstring_u v;
  ulong uVar13;
  int unaff_R13D;
  Dwarf_Unsigned DVar14;
  Dwarf_Chain_conflict head_chain;
  Dwarf_Small *arange_ptr;
  byte *local_d0;
  ulong local_c8;
  int local_length_size;
  Dwarf_Unsigned local_b8;
  int local_extension_size;
  Dwarf_Off info_offset;
  uint local_9c;
  ulong local_98;
  Dwarf_Chain *local_90;
  Dwarf_Unsigned range_length;
  Dwarf_Unsigned area_length;
  Dwarf_Unsigned version;
  Dwarf_Small *local_70;
  Dwarf_Arange **local_68;
  Dwarf_Unsigned *local_60;
  Dwarf_Unsigned local_58;
  Dwarf_Addr range_address;
  
  if ((dbg == (Dwarf_Debug)0x0) || (dbg->de_magic != 0xebfdebfd)) {
    _dwarf_error_string((Dwarf_Debug)0x0,error,0x51,
                        "DW_DLE_DBG_NULL: dbg argument to dwarf_get_aranges()either null or it containsa stale Dwarf_Debug pointer"
                       );
  }
  else {
    iVar7 = _dwarf_load_section(dbg,&dbg->de_debug_aranges,error);
    if (iVar7 != 0) {
      return iVar7;
    }
    iVar7 = _dwarf_load_debug_info(dbg,error);
    if (iVar7 != 0) {
      return iVar7;
    }
    pDVar9 = (Dwarf_Chain_conflict)0x0;
    arange_ptr = (Dwarf_Small *)0x0;
    version = 0;
    info_offset = 0;
    head_chain = (Dwarf_Chain_conflict)0x0;
    DVar3 = (dbg->de_debug_aranges).dss_size;
    local_68 = aranges;
    local_60 = (Dwarf_Unsigned *)returned_count;
    if (DVar3 == 0) {
      unaff_R13D = -1;
      local_b8 = 0;
    }
    else {
      arange_ptr = (dbg->de_debug_aranges).dss_data;
      endsection = arange_ptr + DVar3;
      local_90 = &head_chain;
      local_b8 = 0;
      local_70 = arange_ptr;
      local_58 = DVar3;
      do {
        pDVar6 = arange_ptr;
        area_length = 0;
        local_extension_size = 0;
        if (endsection <= arange_ptr) {
LAB_00154080:
          free_aranges_chain(dbg,head_chain);
          errval = 0x14f;
          goto LAB_00154092;
        }
        iVar7 = _dwarf_read_area_length_ck_wrapper
                          (dbg,&area_length,&arange_ptr,&local_length_size,&local_extension_size,
                           local_58,endsection,error);
        if (iVar7 != 0) {
          free_aranges_chain(dbg,head_chain);
          iVar8 = 1;
          unaff_R13D = iVar7;
          goto LAB_001540a8;
        }
        uVar12 = (dbg->de_debug_aranges).dss_size;
        if (((uVar12 < area_length) ||
            (uVar12 < (long)local_extension_size + (long)local_length_size + area_length)) ||
           (end_arange = arange_ptr + area_length, endsection < end_arange)) goto LAB_00154080;
        if (area_length == 0) {
          iVar8 = 3;
        }
        else {
          iVar7 = _dwarf_read_unaligned_ck_wrapper(dbg,&version,arange_ptr,2,end_arange,error);
          if (iVar7 == 0) {
            arange_ptr = arange_ptr + 2;
            if (end_arange <= arange_ptr) goto LAB_00154080;
            if (version != 2) {
              free_aranges_chain(dbg,head_chain);
              errval = 0x30;
              goto LAB_00154092;
            }
            iVar7 = _dwarf_read_unaligned_ck_wrapper
                              (dbg,&info_offset,arange_ptr,local_length_size,end_arange,error);
            if (iVar7 != 0) goto LAB_001540e9;
            arange_ptr = arange_ptr + local_length_size;
            if (end_arange <= arange_ptr) goto LAB_00154080;
            pbVar1 = arange_ptr;
            if ((dbg->de_debug_info).dss_size <= info_offset) goto LAB_0015421f;
            bVar2 = *arange_ptr;
            local_c8 = (ulong)bVar2;
            local_d0 = end_arange;
            if (bVar2 < 9) {
              if (local_c8 == 0) {
                free_aranges_chain(dbg,head_chain);
                errval = 0x173;
                goto LAB_00154092;
              }
              pbVar1 = arange_ptr + 1;
              if (end_arange <= pbVar1) {
LAB_0015421f:
                arange_ptr = pbVar1;
                free_aranges_chain(dbg,head_chain);
                errval = 0x86;
                goto LAB_00154092;
              }
              local_9c = (uint)*pbVar1;
              if (*pbVar1 == 0) {
                arange_ptr = arange_ptr + 2;
                pbVar1 = arange_ptr;
                if (arange_ptr <= end_arange) {
                  uVar13 = (ulong)((uint)bVar2 * 2);
                  uVar12 = (ulong)((long)arange_ptr - (long)pDVar6) % uVar13;
                  local_98 = local_c8;
                  if (uVar12 != 0) {
                    arange_ptr = arange_ptr + (uVar13 - uVar12);
                  }
                  do {
                    range_address = 0;
                    range_length = 0;
                    iVar7 = _dwarf_read_unaligned_ck_wrapper
                                      (dbg,&range_address,arange_ptr,(int)local_c8,local_d0,error);
                    if (iVar7 == 0) {
                      arange_ptr = arange_ptr + local_98;
                      iVar7 = _dwarf_read_unaligned_ck_wrapper
                                        (dbg,&range_length,arange_ptr,(int)local_c8,local_d0,error);
                      if (iVar7 != 0) goto LAB_001542c7;
                      arange_ptr = arange_ptr + local_98;
                      pcVar10 = _dwarf_get_alloc(dbg,'\x11',1);
                      if (pcVar10 == (char *)0x0) {
LAB_001543a3:
                        free_aranges_chain(dbg,head_chain);
                        _dwarf_error(dbg,error,0x3e);
                        unaff_R13D = 1;
                        bVar5 = false;
                      }
                      else {
                        pcVar10[0] = '\0';
                        pcVar10[1] = '\0';
                        pcVar10[2] = '\0';
                        pcVar10[3] = '\0';
                        pcVar10[4] = '\0';
                        pcVar10[5] = '\0';
                        pcVar10[6] = '\0';
                        pcVar10[7] = '\0';
                        *(short *)(pcVar10 + 0x28) = (short)local_9c;
                        *(Dwarf_Addr *)(pcVar10 + 8) = range_address;
                        *(Dwarf_Unsigned *)(pcVar10 + 0x10) = range_length;
                        *(Dwarf_Off *)(pcVar10 + 0x18) = info_offset;
                        *(Dwarf_Debug *)(pcVar10 + 0x20) = dbg;
                        local_b8 = local_b8 + 1;
                        pDVar9 = (Dwarf_Chain_conflict)_dwarf_get_alloc(dbg,'\x1f',1);
                        if (pDVar9 == (Dwarf_Chain_conflict)0x0) {
                          dwarf_dealloc(dbg,pcVar10,0x11);
                          goto LAB_001543a3;
                        }
                        pDVar9->ch_item = pcVar10;
                        pDVar9->ch_itemtype = 0x11;
                        *local_90 = pDVar9;
                        local_90 = &pDVar9->ch_next;
                        bVar5 = true;
                      }
                    }
                    else {
LAB_001542c7:
                      free_aranges_chain(dbg,head_chain);
                      bVar5 = false;
                      unaff_R13D = iVar7;
                    }
                    if (!bVar5) goto LAB_001540f9;
                  } while (arange_ptr + uVar13 <= local_d0);
                  if (local_d0 < arange_ptr) {
                    local_c8 = (long)arange_ptr - (long)local_d0;
                    v = (long)arange_ptr - (long)local_70;
                    dwarfstring_constructor((dwarfstring_s *)&range_address);
                    dwarfstring_append_printf_u
                              ((dwarfstring_s *)&range_address,"DW_DLE_ARANGE_LENGTH_BAD. 0x%08llx",
                               local_c8);
                    dwarfstring_append_printf_u
                              ((dwarfstring_s *)&range_address,
                               " pad bytes at offset 0x%08llx in .debug_aranges",v);
                    pcVar10 = dwarfstring_string((dwarfstring_s *)&range_address);
                    dwarf_insert_harmless_error(dbg,pcVar10);
                    dwarfstring_destructor((dwarfstring_s *)&range_address);
                  }
                  arange_ptr = local_d0;
                  iVar8 = 0;
                  goto LAB_001540a8;
                }
                goto LAB_0015421f;
              }
              arange_ptr = pbVar1;
              free_aranges_chain(dbg,head_chain);
              _dwarf_error_string(dbg,error,0x87,
                                  "DW_DLE_SEGMENT_SIZE_BAD: segment selector size > 0 is not supported"
                                 );
            }
            else {
              free_aranges_chain(dbg,head_chain);
              errval = 0x32;
LAB_00154092:
              _dwarf_error(dbg,error,errval);
            }
            iVar8 = 1;
            unaff_R13D = 1;
          }
          else {
LAB_001540e9:
            free_aranges_chain(dbg,head_chain);
            unaff_R13D = iVar7;
LAB_001540f9:
            iVar8 = 1;
          }
        }
LAB_001540a8:
        if ((iVar8 != 3) && (iVar8 != 0)) goto LAB_00154470;
      } while (arange_ptr < endsection);
      if (arange_ptr == endsection) {
        unaff_R13D = 0;
        pDVar9 = head_chain;
      }
      else {
        free_aranges_chain(dbg,head_chain);
        _dwarf_error(dbg,error,0x89);
        unaff_R13D = 1;
LAB_00154470:
        local_b8 = 0;
        pDVar9 = (Dwarf_Chain_conflict)0x0;
      }
    }
    DVar3 = local_b8;
    if (unaff_R13D != 0) {
      free_aranges_chain(dbg,pDVar9);
      return unaff_R13D;
    }
    ppDVar11 = (Dwarf_Arange *)_dwarf_get_alloc(dbg,'\x0f',local_b8);
    if (ppDVar11 != (Dwarf_Arange *)0x0) {
      if (0 < (long)DVar3) {
        DVar14 = 0;
        do {
          ppDVar11[DVar14] = (Dwarf_Arange)pDVar9->ch_item;
          pDVar9->ch_item = (void *)0x0;
          pDVar4 = pDVar9->ch_next;
          dwarf_dealloc(dbg,pDVar9,0x1f);
          DVar14 = DVar14 + 1;
          pDVar9 = pDVar4;
        } while (DVar3 != DVar14);
      }
      *local_68 = ppDVar11;
      *local_60 = DVar3;
      return 0;
    }
    _dwarf_error(dbg,error,0x3e);
    free_aranges_chain(dbg,pDVar9);
  }
  return 1;
}

Assistant:

int
dwarf_get_aranges(Dwarf_Debug dbg,
    Dwarf_Arange ** aranges,
    Dwarf_Signed * returned_count, Dwarf_Error * error)
{
    /* Count of total number of aranges. */
    Dwarf_Signed arange_count = 0;

    Dwarf_Arange *arange_block = 0;

    /* Used to chain Dwarf_Aranges structs. */
    Dwarf_Chain curr_chain = NULL;
    Dwarf_Chain head_chain = NULL;
    Dwarf_Signed i = 0;
    int res = DW_DLV_ERROR;

    /* ***** BEGIN CODE ***** */

    CHECK_DBG(dbg,error,"dwarf_get_aranges()");
    res = _dwarf_load_section(dbg, &dbg->de_debug_aranges, error);
    if (res != DW_DLV_OK) {
        return res;
    }
    /*  aranges points in to info, so if info needs expanding
        we have to load it. */
    res = _dwarf_load_debug_info(dbg, error);
    if (res != DW_DLV_OK) {
        return res;
    }

    res = _dwarf_get_aranges_list(dbg,&head_chain,
        &arange_count,error);
    if (res != DW_DLV_OK) {
        free_aranges_chain(dbg,head_chain);
        return res;
    }

    arange_block = (Dwarf_Arange *)
        _dwarf_get_alloc(dbg, DW_DLA_LIST, arange_count);
    if (arange_block == NULL) {
        _dwarf_error(dbg, error, DW_DLE_ALLOC_FAIL);
        free_aranges_chain(dbg,head_chain);
        return DW_DLV_ERROR;
    }

    /* See also free_aranges_chain() above */
    curr_chain = head_chain;
    for (i = 0; i < arange_count; i++) {
        Dwarf_Chain prev = 0;

        /*  Copies pointers. No dealloc of ch_item, */
        *(arange_block + i) = curr_chain->ch_item;
        curr_chain->ch_item = 0;
        prev = curr_chain;
        curr_chain = curr_chain->ch_next;
        dwarf_dealloc(dbg, prev, DW_DLA_CHAIN);
    }
    *aranges = arange_block;
    *returned_count = (arange_count);
    return DW_DLV_OK;
}